

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,size_t pos,
          StringPtr *params)

{
  size_t *psVar1;
  uint uVar2;
  RawBrandedSchema *pRVar3;
  size_t sVar4;
  void *__s2;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar12;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar13;
  size_t sVar14;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar15;
  Entry *this_00;
  ulong targetSize;
  undefined8 *in_R9;
  ArrayPtr<const_unsigned_char> s_00;
  Maybe<unsigned_long> MVar16;
  
  this_00 = table.ptr;
  uVar7 = *(size_t *)&(this_00->value).index * 2;
  if (uVar7 < ((this_00->key).content.size_ + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar7) {
      targetSize = uVar7;
    }
    HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>::rehash
              ((HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *)
               this_00,targetSize);
  }
  s_00.size_ = in_R9[1] - 1;
  s_00.ptr = (uchar *)*in_R9;
  uVar8 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s_00);
  uVar9 = kj::_::chooseBucket((uint)(uVar8 != 0),(uint)*(size_t *)&(this_00->value).index);
  pRVar3 = (this_00->value).parent.super_Schema.raw;
  sVar4 = *(size_t *)&(this_00->value).index;
  __s2 = (void *)*in_R9;
  lVar5 = in_R9[1];
  paVar15 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar12 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (&pRVar3->generic + uVar9);
    uVar2 = *(uint *)((long)paVar12 + 4);
    if (uVar2 == 1) {
      if (paVar15 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar15 = paVar12;
      }
    }
    else {
      if (uVar2 == 0) {
        if (paVar15 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(this_00->key).content.size_;
          *psVar1 = *psVar1 - 1;
          paVar12 = paVar15;
        }
        aVar13.value = ((ulong)(uVar8 != 0) | (long)params << 0x20) + 0x200000000;
        paVar12->value = (unsigned_long)aVar13;
        *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
        goto LAB_003a2ae9;
      }
      if (*(uint *)paVar12 == (uint)(uVar8 != 0)) {
        lVar11 = (ulong)(uVar2 - 2) * 0x50;
        lVar6 = *(long *)(table.size_ + 8 + lVar11);
        if ((lVar6 == lVar5) &&
           (iVar10 = bcmp(*(void **)(lVar11 + table.size_),__s2,lVar6 - 1), iVar10 == 0)) {
          *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
          aVar13 = extraout_RDX;
LAB_003a2ae9:
          MVar16.ptr.field_1.value = aVar13.value;
          MVar16.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar16.ptr;
        }
      }
    }
    sVar14 = (ulong)uVar9 + 1;
    uVar9 = (uint)sVar14;
    if (sVar14 == sVar4) {
      uVar9 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }